

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclientconnector.hpp
# Opt level: O1

void __thiscall
TestClientConnector::VerifyNotificationRequest
          (TestClientConnector *this,version version,string *name)

{
  code *pcVar1;
  char extraout_AL;
  char extraout_AL_00;
  bool bVar2;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  reference pvVar3;
  double __x;
  double __x_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double __x_01;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar4;
  ResultBuilder DOCTEST_RB;
  const_iterator local_190;
  ExpressionDecomposer local_16c;
  ResultBuilder local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  const_iterator local_98;
  Result local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  
  doctest::String::String((String *)&local_190,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_168,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
             ,0x3b,"request[\"method\"] == name","",(String *)&local_190);
  doctest::String::~String((String *)&local_190);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&local_98,DT_CHECK);
  local_d8._M_dataplus._M_p =
       (pointer)nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)&this->request,"method");
  local_d8._M_string_length._0_4_ = local_98.m_object._0_4_;
  doctest::detail::
  Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
  ::operator==((Result *)&local_190,
               (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                *)&local_d8,name);
  doctest::detail::ResultBuilder::setResult(&local_168,(Result *)&local_190);
  doctest::String::~String((String *)&local_190.m_it);
  doctest::detail::ResultBuilder::log(&local_168,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&local_168);
  doctest::String::~String((String *)&local_168.super_AssertData.m_exception_string);
  doctest::String::~String(&local_168.super_AssertData.m_decomp);
  doctest::String::~String(&local_168.super_AssertData.m_exception);
  if (version == v2) {
    doctest::String::String((String *)&local_190,"");
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_168,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x3d,"request[\"jsonrpc\"] == \"2.0\"","",(String *)&local_190);
    doctest::String::~String((String *)&local_190);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer
              ((ExpressionDecomposer *)&local_98,DT_CHECK);
    local_d8._M_dataplus._M_p =
         (pointer)nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)&this->request,"jsonrpc");
    local_d8._M_string_length._0_4_ = local_98.m_object._0_4_;
    doctest::detail::
    Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
    ::operator==((Result *)&local_190,
                 (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                  *)&local_d8,(char (*) [4])"2.0");
    doctest::detail::ResultBuilder::setResult(&local_168,(Result *)&local_190);
    doctest::String::~String((String *)&local_190.m_it);
    doctest::detail::ResultBuilder::log(&local_168,__x_00);
    if (extraout_AL_00 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(&local_168);
    doctest::String::~String((String *)&local_168.super_AssertData.m_exception_string);
    doctest::String::~String(&local_168.super_AssertData.m_decomp);
    doctest::String::~String(&local_168.super_AssertData.m_exception);
    doctest::String::String((String *)&local_190,"");
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_168,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x3e,"!has_key(request, \"id\")","",(String *)&local_190);
    doctest::String::~String((String *)&local_190);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer
              ((ExpressionDecomposer *)&local_b8,DT_CHECK);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"id","");
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::find<std::__cxx11::string_const&>
              (&local_190,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&this->request,&local_58);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&local_d8,&this->request);
    bVar2 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_190,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_d8);
    local_78._0_8_ = (ulong)bVar2 | (long)local_b8._M_dataplus._M_p << 0x20;
    doctest::detail::Expression_lhs::operator_cast_to_Result
              ((Result *)&local_98,(Expression_lhs *)&local_78);
    doctest::detail::ResultBuilder::setResult(&local_168,(Result *)&local_98);
    doctest::String::~String((String *)&local_98.m_it);
    dVar4 = extraout_XMM0_Qa;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      dVar4 = extraout_XMM0_Qa_00;
    }
    doctest::detail::ResultBuilder::log(&local_168,dVar4);
    if (extraout_AL_01 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(&local_168);
  }
  else {
    doctest::String::String((String *)&local_190,"");
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_168,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x40,"!has_key(request, \"jsonrpc\")","",(String *)&local_190);
    doctest::String::~String((String *)&local_190);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer
              ((ExpressionDecomposer *)&local_b8,DT_CHECK);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"jsonrpc","");
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::find<std::__cxx11::string_const&>
              (&local_98,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&this->request,&local_d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&local_58,&this->request);
    bVar2 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_98,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_58);
    local_78._0_8_ = (ulong)bVar2 | (long)local_b8._M_dataplus._M_p << 0x20;
    doctest::detail::Expression_lhs::operator_cast_to_Result
              ((Result *)&local_190,(Expression_lhs *)&local_78);
    doctest::detail::ResultBuilder::setResult(&local_168,(Result *)&local_190);
    doctest::String::~String((String *)&local_190.m_it);
    dVar4 = extraout_XMM0_Qa_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      dVar4 = extraout_XMM0_Qa_02;
    }
    doctest::detail::ResultBuilder::log(&local_168,dVar4);
    if (extraout_AL_02 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(&local_168);
    doctest::String::~String((String *)&local_168.super_AssertData.m_exception_string);
    doctest::String::~String(&local_168.super_AssertData.m_decomp);
    doctest::String::~String(&local_168.super_AssertData.m_exception);
    doctest::String::String((String *)&local_190,"");
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_168,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x41,"request[\"id\"].is_null()","",(String *)&local_190);
    doctest::String::~String((String *)&local_190);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer
              ((ExpressionDecomposer *)&local_78,DT_CHECK);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&this->request,"id");
    local_d8._M_dataplus._M_p = (pointer)((ulong)(pvVar3->m_type == null) | local_78._0_8_ << 0x20);
    doctest::detail::Expression_lhs::operator_cast_to_Result
              ((Result *)&local_190,(Expression_lhs *)&local_d8);
    doctest::detail::ResultBuilder::setResult(&local_168,(Result *)&local_190);
    doctest::String::~String((String *)&local_190.m_it);
    doctest::detail::ResultBuilder::log(&local_168,__x_01);
    if (extraout_AL_03 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(&local_168);
    doctest::String::~String((String *)&local_168.super_AssertData.m_exception_string);
    doctest::String::~String(&local_168.super_AssertData.m_decomp);
    doctest::String::~String(&local_168.super_AssertData.m_exception);
    doctest::String::String((String *)&local_190,"");
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_168,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x42,"has_key(request, \"params\")","",(String *)&local_190);
    doctest::String::~String((String *)&local_190);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_16c,DT_CHECK);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"params","");
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::find<std::__cxx11::string_const&>
              (&local_190,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&this->request,&local_b8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&local_d8,&this->request);
    bVar2 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_190,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_d8);
    local_38 = (ulong)!bVar2 | (ulong)local_16c.m_at << 0x20;
    doctest::detail::Expression_lhs::operator_cast_to_Result(&local_78,(Expression_lhs *)&local_38);
    doctest::detail::ResultBuilder::setResult(&local_168,&local_78);
    doctest::String::~String(&local_78.m_decomp);
    dVar4 = extraout_XMM0_Qa_03;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      dVar4 = extraout_XMM0_Qa_04;
    }
    doctest::detail::ResultBuilder::log(&local_168,dVar4);
    if (extraout_AL_04 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(&local_168);
  }
  doctest::String::~String((String *)&local_168.super_AssertData.m_exception_string);
  doctest::String::~String(&local_168.super_AssertData.m_decomp);
  doctest::String::~String(&local_168.super_AssertData.m_exception);
  return;
}

Assistant:

void VerifyNotificationRequest(version version, const string &name) {
    CHECK(request["method"] == name);
    if (version == version::v2) {
      CHECK(request["jsonrpc"] == "2.0");
      CHECK(!has_key(request, "id"));
    } else {
      CHECK(!has_key(request, "jsonrpc"));
      CHECK(request["id"].is_null());
      CHECK(has_key(request, "params"));
    }
  }